

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O2

Nonnull<cord_internal::CordRepFlat_*> __thiscall
absl::lts_20250127::Cord::InlineRep::MakeFlatWithExtraCapacity(InlineRep *this,size_t extra)

{
  size_t sVar1;
  CordRepFlat *pCVar2;
  
  sVar1 = cord_internal::InlineData::Rep::inline_size((Rep *)this);
  pCVar2 = cord_internal::CordRepFlat::NewImpl<4096ul>(extra + sVar1);
  (pCVar2->super_CordRep).length = sVar1;
  cord_internal::InlineData::copy_max_inline_to
            (&this->data_,(char *)(pCVar2->super_CordRep).storage);
  return pCVar2;
}

Assistant:

inline absl::Nonnull<cord_internal::CordRepFlat*>
Cord::InlineRep::MakeFlatWithExtraCapacity(size_t extra) {
  static_assert(cord_internal::kMinFlatLength >= sizeof(data_), "");
  size_t len = data_.inline_size();
  auto* result = CordRepFlat::New(len + extra);
  result->length = len;
  data_.copy_max_inline_to(result->Data());
  return result;
}